

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

int __thiscall QTreeViewPrivate::itemDecorationAt(QTreeViewPrivate *this,QPoint *pos)

{
  bool bVar1;
  QTreeView *pQVar2;
  ulong uVar3;
  undefined8 in_RSI;
  QTreeViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int viewItemIndex;
  int column;
  bool spanned;
  QTreeView *q;
  QRect returning;
  QModelIndex index;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  QHeaderView *this_00;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  QTreeView *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  bool local_81;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar4;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  QTreeViewPrivate *in_stack_ffffffffffffffa8;
  undefined1 local_48 [40];
  QModelIndex local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  QAbstractItemViewPrivate::executePostedLayout
            ((QAbstractItemViewPrivate *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  local_81 = false;
  bVar1 = QSet<QPersistentModelIndex>::isEmpty((QSet<QPersistentModelIndex> *)0x8f464a);
  if (!bVar1) {
    local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_20.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    local_20.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)&(pQVar2->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x1f0))(&local_20,pQVar2,in_RSI);
    bVar1 = QModelIndex::isValid
                      ((QModelIndex *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40))
    ;
    if (bVar1) {
      in_stack_ffffffffffffff64 = QModelIndex::row(&local_20);
      QModelIndex::parent((QModelIndex *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      local_81 = QTreeView::isFirstColumnSpanned
                           ((QTreeView *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            (int)((ulong)pQVar2 >> 0x20),
                            (QModelIndex *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      in_stack_ffffffffffffff58 = pQVar2;
    }
  }
  if (local_81 == false) {
    this_00 = in_RDI->header;
    QPoint::x((QPoint *)0x8f4725);
    QHeaderView::logicalIndexAt(this_00,in_stack_ffffffffffffff44);
  }
  bVar1 = isTreePosition((QTreeViewPrivate *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c);
  if (bVar1) {
    QPoint::y((QPoint *)0x8f4766);
    iVar4 = itemAtCoordinate(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    modelIndex((QTreeViewPrivate *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),(int)in_stack_ffffffffffffff58);
    local_48._0_16_ =
         (undefined1  [16])
         itemDecorationRect((QTreeViewPrivate *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            (QModelIndex *)
                            CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    uVar3 = QRect::contains((QPoint *)local_48,SUB81(in_RSI,0));
    if ((uVar3 & 1) == 0) {
      iVar4 = -1;
    }
  }
  else {
    iVar4 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

int QTreeViewPrivate::itemDecorationAt(const QPoint &pos) const
{
    Q_Q(const QTreeView);
    executePostedLayout();
    bool spanned = false;
    if (!spanningIndexes.isEmpty()) {
        const QModelIndex index = q->indexAt(pos);
        if (index.isValid())
            spanned = q->isFirstColumnSpanned(index.row(), index.parent());
    }
    const int column = spanned ? 0 : header->logicalIndexAt(pos.x());
    if (!isTreePosition(column))
        return -1; // no logical index at x

    int viewItemIndex = itemAtCoordinate(pos.y());
    QRect returning = itemDecorationRect(modelIndex(viewItemIndex));
    if (!returning.contains(pos))
        return -1;

    return viewItemIndex;
}